

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O3

void readRestartInterval(ifstream *inFile,Header *header)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Reading Restart Interval \n",0x1a);
  iVar1 = std::istream::get();
  iVar2 = std::istream::get();
  iVar3 = std::istream::get();
  iVar4 = std::istream::get();
  header->restartInterval = iVar4 + iVar3 * 0x100;
  if (iVar2 + iVar1 * 0x100 != 4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Error read Restart Interval \n",0x1d);
    header->valid = false;
  }
  return;
}

Assistant:

void readRestartInterval(std::ifstream& inFile, Header* const header) {
	std::cout << "Reading Restart Interval \n";
	uint length = (inFile.get() << 8) + inFile.get();
	header->restartInterval = (inFile.get() << 8) + inFile.get();
	if (length - 4 != 0) {
		std::cout << "Error read Restart Interval \n";
		header->valid = false;
	}
}